

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::InsertSymbolToRegSlotList
          (FunctionBody *this,RegSlot reg,PropertyId propertyId,RegSlot totalRegsCount)

{
  code *pcVar1;
  bool bVar2;
  PropertyIdOnRegSlotsContainer *pPVar3;
  Recycler *pRVar4;
  int **ppiVar5;
  undefined4 *puVar6;
  RegSlot totalRegsCount_local;
  PropertyId propertyId_local;
  RegSlot reg_local;
  FunctionBody *this_local;
  
  if (totalRegsCount != 0) {
    pPVar3 = GetPropertyIdOnRegSlotsContainer(this);
    if (pPVar3 == (PropertyIdOnRegSlotsContainer *)0x0) {
      pRVar4 = ScriptContext::GetRecycler
                         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
      pPVar3 = PropertyIdOnRegSlotsContainer::New(pRVar4);
      SetPropertyIdOnRegSlotsContainer(this,pPVar3);
    }
    pPVar3 = GetPropertyIdOnRegSlotsContainer(this);
    ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)pPVar3);
    if (*ppiVar5 == (int *)0x0) {
      pPVar3 = GetPropertyIdOnRegSlotsContainer(this);
      pRVar4 = ScriptContext::GetRecycler
                         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
      PropertyIdOnRegSlotsContainer::CreateRegSlotsArray(pPVar3,pRVar4,totalRegsCount);
    }
    pPVar3 = GetPropertyIdOnRegSlotsContainer(this);
    if (pPVar3 == (PropertyIdOnRegSlotsContainer *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x134e,"(this->GetPropertyIdOnRegSlotsContainer() != nullptr)",
                                  "this->GetPropertyIdOnRegSlotsContainer() != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pPVar3 = GetPropertyIdOnRegSlotsContainer(this);
    PropertyIdOnRegSlotsContainer::Insert(pPVar3,reg,propertyId);
  }
  return;
}

Assistant:

void FunctionBody::InsertSymbolToRegSlotList(RegSlot reg, PropertyId propertyId, RegSlot totalRegsCount)
    {
        if (totalRegsCount > 0)
        {
            if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
            {
                this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
            }

            if (this->GetPropertyIdOnRegSlotsContainer()->propertyIdsForRegSlots == nullptr)
            {
                this->GetPropertyIdOnRegSlotsContainer()->CreateRegSlotsArray(m_scriptContext->GetRecycler(), totalRegsCount);
            }

            Assert(this->GetPropertyIdOnRegSlotsContainer() != nullptr);
            this->GetPropertyIdOnRegSlotsContainer()->Insert(reg, propertyId);
        }
    }